

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::CustomExternalWrapperObject::GetEnumerator::WrapperOwnKeysEnumerator::MoveAndGetNext
          (WrapperOwnKeysEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  Type *element;
  uint uVar1;
  uint uVar2;
  JavascriptArray *pJVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  uint extraout_var;
  JavascriptString *propertyKey;
  char16 *pcVar8;
  Var aValue;
  undefined1 local_88 [8];
  PropertyDescriptor desc;
  CharacterBuffer<char16_t> propertyString;
  JavascriptString *local_40;
  RecyclableObject *obj;
  
  *propertyId = -1;
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  pJVar3 = (this->trapResult).ptr;
  if (pJVar3 != (JavascriptArray *)0x0) {
    uVar1 = (pJVar3->super_ArrayObject).length;
    do {
      uVar2 = this->index;
      if (uVar1 <= uVar2) break;
      pJVar3 = (this->trapResult).ptr;
      this->index = uVar2 + 1;
      iVar6 = (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar3,(ulong)uVar2);
      obj = (RecyclableObject *)CONCAT44(extraout_var,iVar6);
      bVar4 = true;
      if ((extraout_var >> 0x10 == 0 && obj != (RecyclableObject *)0x0) &&
         (bVar5 = VarIsImpl<Js::JavascriptString>(obj), bVar5)) {
        propertyKey = VarTo<Js::JavascriptString>(obj);
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_88);
        BVar7 = JavascriptOperators::GetOwnPropertyDescriptor
                          ((RecyclableObject *)(this->wrapper).ptr,propertyKey,this->scriptContext,
                           (PropertyDescriptor *)local_88);
        pcVar8 = JavascriptString::GetString(propertyKey);
        JavascriptString::GetLength(propertyKey);
        element = &desc.Configurable;
        Memory::Recycler::WBSetBit(element);
        desc._40_8_ = pcVar8;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(element);
        bVar4 = true;
        if ((BVar7 != 0) &&
           (bVar5 = JsUtil::
                    BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::Contains((this->visited).ptr,(CharacterBuffer<char16_t> *)element), !bVar5)) {
          JsUtil::
          BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Add((this->visited).ptr,(CharacterBuffer<char16_t> *)element);
          bVar5 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_88);
          if (bVar5) {
            aValue = CrossSite::MarshalVar
                               (this->scriptContext,propertyKey,
                                (((((propertyKey->super_RecyclableObject).type.ptr)->
                                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                                scriptContext.ptr);
            local_40 = VarTo<Js::JavascriptString>(aValue);
            bVar4 = false;
          }
        }
      }
    } while (bVar4);
    if (uVar2 < uVar1) {
      return local_40;
    }
  }
  return (JavascriptString *)0x0;
}

Assistant:

virtual JavascriptString * MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes = nullptr) override
        {
            propertyId = Constants::NoProperty;
            if (attributes != nullptr)
            {
                *attributes = PropertyEnumerable;
            }
            // 13.7.5.15 EnumerateObjectProperties(O) (https://tc39.github.io/ecma262/#sec-enumerate-object-properties)
            // for (let key of Reflect.ownKeys(obj)) {
            if (trapResult != nullptr)
            {
                uint32 len = trapResult->GetLength();
                while (index < len)
                {
                    Var var = trapResult->DirectGetItem(index++);
                    if (var)
                    {
                        // if (typeof key === "string") {
                        if (VarIs<JavascriptString>(var))
                        {
                            JavascriptString* propertyName = VarTo<JavascriptString>(var);
                            // let desc = Reflect.getOwnPropertyDescriptor(obj, key);
                            Js::PropertyDescriptor desc;
                            BOOL ret = JavascriptOperators::GetOwnPropertyDescriptor(wrapper, propertyName, scriptContext, &desc);
                            const JsUtil::CharacterBuffer<WCHAR> propertyString(propertyName->GetString(), propertyName->GetLength());
                            // if (desc && !visited.has(key)) {
                            if (ret && !visited->Contains(propertyString))
                            {
                                visited->Add(propertyString);
                                // if (desc.enumerable) yield key;
                                if (desc.IsEnumerable())
                                {
                                    //TODO: (vsadov) not sure if should marshal here, it is "getting"
                                    return VarTo<JavascriptString>(CrossSite::MarshalVar(
                                        scriptContext, propertyName, propertyName->GetScriptContext()));
                                }
                            }
                        }
                    }
                }
            }
            return nullptr;
        }